

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateTypeDefinition(ExpressionTranslateContext *ctx,TypeBase *type)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  TypeEnum *typeEnum;
  long lVar5;
  
  if ((type->hasTranslation == false) && (type->hasTranslation = true, type->isGeneric == false)) {
    switch(type->typeID) {
    case 0x13:
      TranslateTypeDefinition(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx,"struct ");
      PrintEscapedName(ctx,type->name);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      PrintIndent(ctx);
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx," ptr[%lld];",
            (ulong)(-(*(int *)(type[1]._vptr_TypeBase + 6) * (int)*(long *)&type[1].typeID) & 3) +
            *(long *)&type[1].typeID);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"& set(unsigned index, ");
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx," const& val){ ptr[index] = val; return *this; }");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx,
            "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }"
            ,(ulong)type[1].typeID);
      OutputContext::Print(ctx->output,"\n",1);
      break;
    default:
      goto switchD_001414ea_caseD_14;
    case 0x15:
      Print(ctx,"struct __typeProxy_");
      PrintEscapedName(ctx,type->name);
      Print(ctx,"{};");
      OutputContext::Print(ctx->output,"\n",1);
      return;
    case 0x18:
      if ((type->importModule != (ModuleData *)0x0) &&
         (*(char *)((long)&type[3]._vptr_TypeBase + 1) != '\0')) {
        return;
      }
      if (*(char *)&type[3]._vptr_TypeBase != '\x01') {
        return;
      }
      lVar5._0_4_ = type[1].typeID;
      lVar5._4_4_ = type[1].nameHash;
      for (; lVar5 != 0; lVar5 = *(long *)(lVar5 + 0x18)) {
        TranslateTypeDefinition(ctx,*(TypeBase **)(*(long *)(lVar5 + 8) + 0x20));
      }
      uVar3 = 0;
      Print(ctx,"struct ");
      PrintEscapedTypeName(ctx,type);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      lVar4._0_4_ = type[1].typeID;
      lVar4._4_4_ = type[1].nameHash;
      if (lVar4 != 0) {
        uVar2 = 0;
        uVar3 = 0;
        do {
          if (uVar2 < *(uint *)(*(long *)(lVar4 + 8) + 0x3c)) {
            PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
          }
          PrintIndent(ctx);
          TranslateTypeName(ctx,*(TypeBase **)(*(long *)(lVar4 + 8) + 0x20));
          Print(ctx," ");
          TranslateVariableName(ctx,*(VariableData **)(lVar4 + 8));
          Print(ctx,";");
          OutputContext::Print(ctx->output,"\n",1);
          plVar1 = (long *)(lVar4 + 8);
          lVar4 = *(long *)(lVar4 + 0x18);
          uVar2 = *(int *)(*plVar1 + 0x3c) + *(int *)(*(long *)(*plVar1 + 0x20) + 0x30);
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (lVar4 != 0);
      }
      if (type->padding != 0) {
        PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
      }
      break;
    case 0x19:
      Print(ctx,"struct ");
      PrintEscapedName(ctx,type->name);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"(): value(0){}");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"(int v): value(v){}");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"int value;");
    }
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"};");
    return;
  }
switchD_001414ea_caseD_14:
  return;
}

Assistant:

void TranslateTypeDefinition(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(type->hasTranslation)
		return;

	type->hasTranslation = true;

	if(type->isGeneric)
		return;

	if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "struct __typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, "{};");
		PrintLine(ctx);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		TranslateTypeDefinition(ctx, typeArray->subType);

		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeArray->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " ptr[%lld];", typeArray->length + ((4 - (typeArray->length * typeArray->subType->size % 4)) & 3)); // Round total byte size to 4
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeArray->name);
		Print(ctx, "& set(unsigned index, ");
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " const& val){ ptr[index] = val; return *this; }");
		PrintLine(ctx);

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }", (unsigned)typeArray->length);
		PrintLine(ctx);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->importModule && typeClass->isInternal)
			return;

		if(!typeClass->completed)
			return;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			TranslateTypeDefinition(ctx, curr->variable->type);

		Print(ctx, "struct ");
		PrintEscapedTypeName(ctx, typeClass);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		unsigned offset = 0;
		unsigned index = 0;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
		{
			if(curr->variable->offset > offset)
				PrintIndentedLine(ctx, "char pad_%d[%d];", index, int(curr->variable->offset - offset));

			PrintIndent(ctx);

			TranslateTypeName(ctx, curr->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable);
			Print(ctx, ";");
			PrintLine(ctx);

			offset = unsigned(curr->variable->offset + curr->variable->type->size);
			index++;
		}

		if(typeClass->padding != 0)
			PrintIndentedLine(ctx, "char pad_%d[%d];", index, typeClass->padding);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeEnum->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(): value(0){}");
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(int v): value(v){}");
		PrintLine(ctx);

		PrintIndentedLine(ctx, "int value;");

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
}